

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxClassPtrCast::Resolve(FxClassPtrCast *this,FCompileContext *ctx)

{
  PPointer *pPVar1;
  PType *this_00;
  PType *this_01;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  char *pcVar5;
  char *pcVar6;
  PClass *pPVar7;
  long *plVar8;
  FxExpression *pFVar9;
  PClass *pPVar10;
  FxClassPtrCast *pFVar3;
  undefined4 extraout_var_00;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex == (FxExpression *)0x0) {
LAB_00539302:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return &((FxClassPtrCast *)0x0)->super_FxExpression;
  }
  iVar2 = (*this->basex->_vptr_FxExpression[2])();
  pFVar3 = (FxClassPtrCast *)CONCAT44(extraout_var,iVar2);
  this->basex = (FxExpression *)pFVar3;
  if (pFVar3 == (FxClassPtrCast *)0x0) goto LAB_00539302;
  pPVar1 = (PPointer *)(pFVar3->super_FxExpression).ValueType;
  this_00 = (this->super_FxExpression).ValueType;
  if (pPVar1 != TypeNullPtr) {
    pPVar4 = (pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar2 = (**(pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                        (pPVar1);
      pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
      (pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class = pPVar4;
    }
    pFVar3 = (FxClassPtrCast *)this->basex;
    this_01 = (pFVar3->super_FxExpression).ValueType;
    if (pPVar4 != PClassPointer::RegistrationInfo.MyClass) {
      if ((this_01 == (PType *)TypeString) || (this_01 == (PType *)TypeName)) {
        plVar8 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar9 = this->basex;
        *plVar8 = (long)&PTR__FxExpression_0070d370;
        FScriptPosition::FScriptPosition((FScriptPosition *)(plVar8 + 1),&pFVar9->ScriptPosition);
        *(undefined2 *)(plVar8 + 4) = 0x100;
        *(undefined4 *)((long)plVar8 + 0x24) = 0x34;
        *plVar8 = (long)&PTR__FxClassTypeCast_0070d100;
        plVar8[3] = (long)this_00;
        plVar8[5] = (long)this_00[1].super_PTypeBase.super_DObject.ObjNext;
        plVar8[6] = (long)pFVar9;
        this->basex = (FxExpression *)0x0;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pFVar9 = (FxExpression *)(**(code **)(*plVar8 + 0x10))(plVar8,ctx);
        return pFVar9;
      }
LAB_005392cd:
      pcVar5 = PType::DescriptiveName(this_01);
      pcVar6 = PType::DescriptiveName(this_00);
      pFVar3 = (FxClassPtrCast *)0x0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "Cannot cast %s to %s. The types are incompatible.",pcVar5,pcVar6);
      goto LAB_00539349;
    }
    pPVar4 = (PClass *)this_01[1].super_PTypeBase.super_DObject.ObjNext;
    pPVar7 = (PClass *)this_00[1].super_PTypeBase.super_DObject.ObjNext;
    pPVar10 = pPVar4;
    if (pPVar4 != pPVar7) {
      do {
        pPVar10 = (PClass *)
                  ((TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                    *)&pPVar10->ParentClass)->Array;
        if (pPVar10 == pPVar7) break;
      } while (pPVar10 != (PClass *)0x0);
      if (pPVar10 == (PClass *)0x0) {
        do {
          pPVar7 = (PClass *)
                   ((TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                     *)&pPVar7->ParentClass)->Array;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
        if (pPVar7 != (PClass *)0x0) {
          return &this->super_FxExpression;
        }
        goto LAB_005392cd;
      }
    }
  }
  (pFVar3->super_FxExpression).ValueType = this_00;
  this->basex = (FxExpression *)0x0;
LAB_00539349:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &pFVar3->super_FxExpression;
}

Assistant:

FxExpression *FxClassPtrCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		// Downcast is always ok.
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		// Upcast needs a runtime check.
		else if (to->ClassRestriction->IsDescendantOf(from->ClassRestriction))
		{
			return this;
		}
	}
	else if (basex->ValueType == TypeString || basex->ValueType == TypeName)
	{
		FxExpression *x = new FxClassTypeCast(to, basex);
		basex = nullptr;
		delete this;
		return x->Resolve(ctx);
	}
	// Everything else is an error.
	ScriptPosition.Message(MSG_ERROR, "Cannot cast %s to %s. The types are incompatible.", basex->ValueType->DescriptiveName(), to->DescriptiveName());
	delete this;
	return nullptr;
}